

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O0

int ks_resize(kstring_t *s,size_t size)

{
  char *pcVar1;
  char *tmp;
  size_t size_local;
  kstring_t *s_local;
  
  if (s->m < size) {
    s->m = size;
    s->m = s->m - 1;
    s->m = s->m >> 1 | s->m;
    s->m = s->m >> 2 | s->m;
    s->m = s->m >> 4 | s->m;
    s->m = s->m >> 8 | s->m;
    s->m = s->m >> 0x10 | s->m;
    s->m = s->m + 1;
    pcVar1 = (char *)realloc(s->s,s->m);
    if (pcVar1 == (char *)0x0) {
      return -1;
    }
    s->s = pcVar1;
  }
  return 0;
}

Assistant:

static inline int ks_resize(kstring_t *s, size_t size)
{
	if (s->m < size) {
		char *tmp;
		s->m = size;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return -1;
	}
	return 0;
}